

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreecheck(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  u8 uVar1;
  ushort uVar2;
  uint uVar3;
  sqlite3 *db;
  int iVar4;
  Vdbe *pVm;
  char *pcVar5;
  char *pcVar6;
  sqlite3_stmt *psVar7;
  Mem *pMVar8;
  char *pcVar9;
  int iVar10;
  Vdbe *pVm_1;
  RtreeCheck local_90;
  sqlite3_context *local_38;
  
  if (nArg - 3U < 0xfffffffe) {
    ctx->isError = 1;
    sqlite3VdbeMemSetStr
              (ctx->pOut,"wrong number of arguments to function rtreecheck()",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  pcVar5 = (char *)sqlite3ValueText(*apArg,'\x01');
  if (nArg == 1) {
    pcVar9 = "main";
    pcVar6 = pcVar5;
  }
  else {
    pcVar6 = (char *)sqlite3ValueText(apArg[1],'\x01');
    pcVar9 = pcVar5;
  }
  db = ctx->pOut->db;
  local_90.zReport = (char *)0x0;
  local_90.nErr = 0;
  local_90._84_4_ = 0;
  local_90.nLeaf = 0;
  local_90.nNonLeaf = 0;
  local_90._64_8_ = 0;
  local_90.aCheckMapping[0] = (sqlite3_stmt *)0x0;
  local_90.aCheckMapping[1] = (sqlite3_stmt *)0x0;
  local_90.bInt = 0;
  local_90.nDim = 0;
  local_90.pGetNode = (sqlite3_stmt *)0x0;
  uVar1 = db->autoCommit;
  local_90.db = db;
  local_90.zDb = pcVar9;
  local_90.zTab = pcVar6;
  if (uVar1 != '\0') {
    iVar4 = sqlite3_exec(db,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    local_90.rc = iVar4;
    iVar10 = -1;
    if (iVar4 != 0) goto LAB_001c8e29;
  }
  psVar7 = rtreeCheckPrepare(&local_90,"SELECT * FROM %Q.\'%q_rowid\'",pcVar9,pcVar6);
  if (psVar7 == (sqlite3_stmt *)0x0) {
    iVar10 = -1;
  }
  else {
    uVar2 = *(ushort *)(psVar7 + 0xc0);
    local_38 = ctx;
    sqlite3_finalize(psVar7);
    iVar10 = 1 - (uint)uVar2;
    ctx = local_38;
  }
  local_90._64_8_ = local_90._64_8_ & 0xffffffff00000000;
LAB_001c8e29:
  psVar7 = rtreeCheckPrepare(&local_90,"SELECT * FROM %Q.%Q",pcVar9);
  if (psVar7 != (sqlite3_stmt *)0x0) {
    local_90.nDim = (int)(iVar10 + (uint)*(ushort *)(psVar7 + 0xc0)) / 2;
    if ((int)(iVar10 + (uint)*(ushort *)(psVar7 + 0xc0)) < 2) {
      rtreeCheckAppendMsg(&local_90,"Schema corrupt or not an rtree");
    }
    else {
      iVar4 = sqlite3_step(psVar7);
      if (iVar4 == 100) {
        pMVar8 = columnMem(psVar7,1);
        uVar3._0_2_ = pMVar8->flags;
        uVar3._2_1_ = pMVar8->enc;
        uVar3._3_1_ = pMVar8->eSubtype;
        columnMallocFailure(psVar7);
        local_90.bInt = (int)((0x50505050U >> (uVar3 & 0x1f) & 1) != 0);
      }
    }
    iVar4 = sqlite3_finalize(psVar7);
    if (iVar4 != 0xb) {
      local_90.rc = iVar4;
    }
  }
  if (0 < local_90.nDim) {
    if (local_90.rc == 0) {
      rtreeCheckNode(&local_90,0,(u8 *)0x0,1);
    }
    rtreeCheckCount(&local_90,"_rowid",(long)local_90.nLeaf);
    rtreeCheckCount(&local_90,"_parent",(long)local_90.nNonLeaf);
  }
  sqlite3_finalize(local_90.pGetNode);
  sqlite3_finalize(local_90.aCheckMapping[0]);
  sqlite3_finalize(local_90.aCheckMapping[1]);
  if (uVar1 == '\0') {
    iVar4 = local_90.rc;
  }
  else {
    iVar4 = sqlite3_exec(db,"END",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    if (local_90.rc != 0) {
      iVar4 = local_90.rc;
    }
    local_90.rc = iVar4;
  }
  pcVar5 = local_90.zReport;
  if (iVar4 == 0) {
    pcVar9 = "ok";
    if (local_90.zReport != (char *)0x0) {
      pcVar9 = local_90.zReport;
    }
    setResultStrOrError(ctx,pcVar9,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(ctx,iVar4);
  }
  sqlite3_free(pcVar5);
  return;
}

Assistant:

static void rtreecheck(
  sqlite3_context *ctx, 
  int nArg, 
  sqlite3_value **apArg
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(ctx, 
        "wrong number of arguments to function rtreecheck()", -1
    );
  }else{
    int rc;
    char *zReport = 0;
    const char *zDb = (const char*)sqlite3_value_text(apArg[0]);
    const char *zTab;
    if( nArg==1 ){
      zTab = zDb;
      zDb = "main";
    }else{
      zTab = (const char*)sqlite3_value_text(apArg[1]);
    }
    rc = rtreeCheckTable(sqlite3_context_db_handle(ctx), zDb, zTab, &zReport);
    if( rc==SQLITE_OK ){
      sqlite3_result_text(ctx, zReport ? zReport : "ok", -1, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_error_code(ctx, rc);
    }
    sqlite3_free(zReport);
  }
}